

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

Graph * __thiscall soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,Graph *g)

{
  visitArray<std::vector<soul::pool_ref<soul::AST::ASTObject>,std::allocator<soul::pool_ref<soul::AST::ASTObject>>>>
            (this,&(g->super_ProcessorBase).super_ModuleBase.specialisationParams);
  visitArray<std::vector<soul::pool_ref<soul::AST::EndpointDeclaration>,std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>>>>
            (this,&(g->super_ProcessorBase).endpoints);
  replaceArray<std::vector<soul::pool_ref<soul::AST::UsingDeclaration>,std::allocator<soul::pool_ref<soul::AST::UsingDeclaration>>>>
            (this,&(g->super_ProcessorBase).super_ModuleBase.usings);
  visitArray<std::vector<soul::pool_ref<soul::AST::ProcessorInstance>,std::allocator<soul::pool_ref<soul::AST::ProcessorInstance>>>>
            (this,&g->processorInstances);
  visitArray<std::vector<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::ProcessorAliasDeclaration>>>>
            (this,&g->processorAliases);
  visitArray<std::vector<soul::pool_ref<soul::AST::Connection>,std::allocator<soul::pool_ref<soul::AST::Connection>>>>
            (this,&g->connections);
  visitArray<std::vector<soul::pool_ref<soul::AST::VariableDeclaration>,std::allocator<soul::pool_ref<soul::AST::VariableDeclaration>>>>
            (this,&g->constants);
  visitArray<std::vector<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>,std::allocator<soul::pool_ref<soul::AST::NamespaceAliasDeclaration>>>>
            (this,&(g->super_ProcessorBase).super_ModuleBase.namespaceAliases);
  visitArray<std::vector<soul::pool_ref<soul::AST::StaticAssertion>,std::allocator<soul::pool_ref<soul::AST::StaticAssertion>>>>
            (this,&(g->super_ProcessorBase).super_ModuleBase.staticAssertions);
  return g;
}

Assistant:

virtual AST::Graph& visit (AST::Graph& g)
    {
        visitArray   (g.specialisationParams);
        visitArray   (g.endpoints);
        replaceArray (g.usings);
        visitArray   (g.processorInstances);
        visitArray   (g.processorAliases);
        visitArray   (g.connections);
        visitArray   (g.constants);
        visitArray   (g.namespaceAliases);
        visitArray   (g.staticAssertions);

        return g;
    }